

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall Parser::match(Parser *this,TokenType type)

{
  bool bVar1;
  Token local_50;
  TokenType local_14;
  Parser *pPStack_10;
  TokenType type_local;
  Parser *this_local;
  
  local_14 = type;
  pPStack_10 = this;
  token(&local_50,this);
  bVar1 = local_50.type == local_14;
  Token::~Token(&local_50);
  return bVar1;
}

Assistant:

bool Parser::match(TokenType type) {
    return token().type == type;
}